

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O2

bool __thiscall PageStack<FinalizableObject_*>::IsEmpty(PageStack<FinalizableObject_*> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char *message;
  char *error;
  uint lineNumber;
  
  if (this->currentChunk == (Chunk *)0x0) {
    if (this->count != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x19c,"(count == 0)","count == 0");
      if (!bVar2) goto LAB_0066686b;
      *puVar3 = 0;
    }
    if (this->nextEntry == (FinalizableObject **)0x0) {
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    error = "(nextEntry == nullptr)";
    message = "nextEntry == nullptr";
    lineNumber = 0x19d;
  }
  else {
    if ((this->nextEntry != this->chunkStart) || (this->currentChunk->nextChunk != (Chunk *)0x0)) {
      if (this->count != 0) {
        return false;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x1a7,"(count != 0)","count != 0");
      if (!bVar2) goto LAB_0066686b;
      bVar2 = false;
      goto LAB_00666812;
    }
    if (this->count == 0) {
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    error = "(count == 0)";
    message = "count == 0";
    lineNumber = 0x1a3;
  }
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                     ,lineNumber,error,message);
  if (!bVar2) {
LAB_0066686b:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  bVar2 = true;
LAB_00666812:
  *puVar3 = 0;
  return bVar2;
}

Assistant:

bool PageStack<T>::IsEmpty() const
{
    if (currentChunk == nullptr)
    {
        Assert(count == 0);
        Assert(nextEntry == nullptr);
        return true;
    }

    if (nextEntry == chunkStart && currentChunk->nextChunk == nullptr)
    {
        Assert(count == 0);
        return true;
    }

    Assert(count != 0);
    return false;
}